

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcms_error_category.cpp
# Opt level: O3

string * __thiscall
cppcms::impl::error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,error_category *this,int cat)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (cat == 1) {
    pcVar2 = "protocol violation";
    pcVar1 = "";
  }
  else if (cat == 0) {
    pcVar2 = "ok";
    pcVar1 = "";
  }
  else {
    pcVar2 = "unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string error_category::message(int cat) const
	{
		switch(cat) {
		case errc::ok: return "ok";
		case errc::protocol_violation: return "protocol violation";
		default:
			return "unknown";
		}
	}